

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::changeRow
          (SPxLPBase<double> *this,int n,LPRowBase<double> *newRow,bool scale)

{
  Item *pIVar1;
  Item *pIVar2;
  int iVar3;
  Nonzero<double> *pNVar4;
  undefined7 in_register_00000009;
  long lVar5;
  int *piVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  double val;
  int idx;
  uint local_4c;
  double local_48;
  undefined4 local_40;
  int local_3c;
  LPRowBase<double> *local_38;
  
  local_40 = (undefined4)CONCAT71(in_register_00000009,scale);
  if (-1 < n) {
    pIVar1 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
             (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[(uint)n].idx;
    lVar5 = (long)(pIVar1->data).super_SVectorBase<double>.memused;
    if (0 < lVar5) {
      do {
        pIVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                 (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey
                 [(pIVar1->data).super_SVectorBase<double>.m_elem[lVar5 + -1].idx].idx;
        pNVar4 = (pIVar2->data).super_SVectorBase<double>.m_elem;
        if ((pNVar4 == (Nonzero<double> *)0x0) ||
           (uVar9 = (ulong)(pIVar2->data).super_SVectorBase<double>.memused, (long)uVar9 < 1)) {
LAB_001c68ad:
          uVar7 = 0xffffffff;
        }
        else {
          if (pNVar4->idx == n) {
            bVar11 = true;
            uVar8 = 0;
          }
          else {
            uVar8 = 0;
            piVar6 = &pNVar4[1].idx;
            do {
              if (uVar9 - 1 == uVar8) goto LAB_001c68ad;
              uVar8 = uVar8 + 1;
              iVar3 = *piVar6;
              piVar6 = piVar6 + 4;
            } while (iVar3 != n);
            bVar11 = uVar8 < uVar9;
          }
          uVar7 = (uint)uVar8;
          if (!bVar11) goto LAB_001c68ad;
        }
        if (-1 < (int)uVar7) {
          lVar10 = (long)(pIVar2->data).super_SVectorBase<double>.memused + -1;
          (pIVar2->data).super_SVectorBase<double>.memused = (int)lVar10;
          if ((int)uVar7 < (int)lVar10) {
            pNVar4[uVar7].idx = pNVar4[lVar10].idx;
            pNVar4[uVar7].val = pNVar4[lVar10].val;
          }
        }
        bVar11 = 1 < lVar5;
        lVar5 = lVar5 + -1;
      } while (bVar11);
    }
    (pIVar1->data).super_SVectorBase<double>.memused = 0;
    local_48 = newRow->left;
    local_4c = n;
    local_38 = newRow;
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x33])
              (this,(ulong)(uint)n,&local_48,(ulong)scale);
    local_48 = newRow->right;
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x36])
              (this,(ulong)local_4c,&local_48,(ulong)scale);
    local_48 = newRow->object;
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x3c])
              (this,(ulong)local_4c,&local_48,(ulong)scale);
    lVar5 = (long)(newRow->vec).super_SVectorBase<double>.memused;
    if (0 < lVar5) {
      lVar10 = lVar5 + 1;
      lVar5 = lVar5 * 0x10 + -8;
      do {
        pNVar4 = (local_38->vec).super_SVectorBase<double>.m_elem;
        local_3c = *(int *)((long)&pNVar4->val + lVar5);
        local_48 = *(double *)((long)pNVar4 + lVar5 + -8);
        if ((char)local_40 != '\0') {
          local_48 = ldexp(local_48,(this->super_LPColSetBase<double>).scaleExp.data[local_3c] +
                                    (this->super_LPRowSetBase<double>).scaleExp.data[(int)local_4c])
          ;
        }
        SVSetBase<double>::add2
                  ((SVSetBase<double> *)this,
                   (SVectorBase<double> *)
                   ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                   (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                   [(int)local_4c].idx),1,&local_3c,&local_48);
        SVSetBase<double>::add2
                  (&(this->super_LPColSetBase<double>).super_SVSetBase<double>,
                   (SVectorBase<double> *)
                   ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                   (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[local_3c].
                   idx),1,(int *)&local_4c,&local_48);
        lVar10 = lVar10 + -1;
        lVar5 = lVar5 + -0x10;
      } while (1 < lVar10);
    }
  }
  return;
}

Assistant:

virtual void changeRow(int n, const LPRowBase<R>& newRow, bool scale = false)
   {
      if(n < 0)
         return;

      int j;
      SVectorBase<R>& row = rowVector_w(n);

      for(j = row.size() - 1; j >= 0; --j)
      {
         SVectorBase<R>& col = colVector_w(row.index(j));
         int position = col.pos(n);

         assert(position != -1);

         if(position >= 0)
            col.remove(position);
      }

      row.clear();

      changeLhs(n, newRow.lhs(), scale);
      changeRhs(n, newRow.rhs(), scale);
      changeRowObj(n, newRow.obj(), scale);

      const SVectorBase<R>& newrow = newRow.rowVector();

      for(j = newrow.size() - 1; j >= 0; --j)
      {
         int idx = newrow.index(j);
         R val = newrow.value(j);

         if(scale)
            val = spxLdexp(val, LPRowSetBase<R>::scaleExp[n] + LPColSetBase<R>::scaleExp[idx]);

         LPRowSetBase<R>::add2(n, 1, &idx, &val);
         LPColSetBase<R>::add2(idx, 1, &n, &val);
      }

      assert(isConsistent());
   }